

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt.c
# Opt level: O2

char * adt_print_info(void)

{
  return 
  "Abstract Data Type Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n"
  ;
}

Assistant:

const char *adt_print_info(void)
{
	static const char adt_info[] =
		"Abstract Data Type Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef ADT_STATIC_DEFINE
		"Compiled as static library type"
#else
		"Compiled as shared library type"
#endif

		"\n";

	return adt_info;
}